

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::OneofOptions::_InternalParse(OneofOptions *this,char *ptr,ParseContext *ctx)

{
  int iVar1;
  undefined1 auVar2 [12];
  byte *ptr_00;
  Rep *pRVar3;
  UninterpretedOption *msg;
  uint32 res;
  uint tag;
  int iVar4;
  pair<const_char_*,_unsigned_int> pVar5;
  pair<const_char_*,_bool> pVar6;
  
LAB_00174042:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) {
        return (char *)(byte *)ptr;
      }
      pVar6 = internal::EpsCopyInputStream::DoneFallback
                        (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar6.first;
      if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        return (char *)(byte *)ptr;
      }
    }
    tag = (uint)(byte)*ptr;
    ptr_00 = (byte *)ptr + 1;
    if (*ptr < '\0') {
      res = (tag + (uint)*ptr_00 * 0x80) - 0x80;
      if ((char)*ptr_00 < '\0') {
        pVar5 = internal::ReadTagFallback(ptr,res);
        auVar2 = pVar5._0_12_;
        if (pVar5.first == (char *)0x0) {
          return (char *)0x0;
        }
      }
      else {
        auVar2._8_4_ = res;
        auVar2._0_8_ = (byte *)ptr + 2;
      }
      ptr_00 = auVar2._0_8_;
      tag = auVar2._8_4_;
      if (tag == 0x1f3a) {
        ptr = (char *)(ptr_00 + -2);
        do {
          pRVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
            iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_;
LAB_001740ff:
            internal::RepeatedPtrFieldBase::Reserve
                      (&(this->uninterpreted_option_).super_RepeatedPtrFieldBase,iVar4 + 1);
            pRVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar4 = pRVar3->allocated_size;
LAB_0017410f:
            pRVar3->allocated_size = iVar4 + 1;
            msg = Arena::CreateMaybeMessage<google::protobuf::UninterpretedOption>
                            ((this->uninterpreted_option_).super_RepeatedPtrFieldBase.arena_);
            pRVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.rep_;
            iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
            pRVar3->elements[iVar4] = msg;
          }
          else {
            iVar1 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
            iVar4 = pRVar3->allocated_size;
            if (iVar4 <= iVar1) {
              if (iVar4 == (this->uninterpreted_option_).super_RepeatedPtrFieldBase.total_size_)
              goto LAB_001740ff;
              goto LAB_0017410f;
            }
            (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
            msg = (UninterpretedOption *)pRVar3->elements[iVar1];
          }
          ptr = internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                          (ctx,msg,(char *)((byte *)ptr + 2));
          if ((byte *)ptr == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((ptr < (ctx->super_EpsCopyInputStream).limit_end_) && (*(short *)ptr == 0x3eba));
        goto LAB_00174042;
      }
    }
    if ((tag == 0) || ((tag & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
      return (char *)ptr_00;
    }
    if (tag < 8000) {
      ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,(char *)ptr_00,ctx);
    }
    else {
      ptr = internal::ExtensionSet::ParseField
                      (&this->_extensions_,(ulong)tag,(char *)ptr_00,
                       (Message *)_OneofOptions_default_instance_,&this->_internal_metadata_,ctx);
    }
    if ((byte *)ptr == (byte *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* OneofOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}